

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# httplib.h
# Opt level: O3

ssize_t __thiscall
httplib::ClientImpl::send(ClientImpl *this,int __fd,void *__buf,size_t __n,int __flags)

{
  mutex *__mutex;
  Socket *socket;
  ClientImpl *this_00;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  *__v;
  _Rb_tree_header *p_Var1;
  size_t *psVar2;
  anon_class_24_3_fff4cb3e SSL_connect_or_accept;
  bool bVar3;
  int iVar4;
  int iVar5;
  uint uVar6;
  int *piVar7;
  ssize_t sVar8;
  SSL *pSVar9;
  pthread_t pVar10;
  iterator iVar11;
  _Rb_tree_node_base *p_Var12;
  ulong uVar13;
  undefined4 in_register_00000034;
  long lVar14;
  pair<std::_Rb_tree_node_base_*,_std::_Rb_tree_node_base_*> pVar15;
  bool close_connection;
  undefined8 *local_e8;
  undefined8 uStack_e0;
  code *local_d8;
  code *pcStack_d0;
  fd_set local_c8;
  timeval local_48;
  
  lVar14 = CONCAT44(in_register_00000034,__fd);
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)&this->request_mutex_);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  __mutex = &this->socket_mutex_;
  iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
  if (iVar4 != 0) {
    std::__throw_system_error(iVar4);
  }
  this->socket_should_be_closed_when_request_is_done_ = false;
  socket = &this->socket_;
  iVar4 = (this->socket_).sock;
  if (iVar4 != -1) {
    if (iVar4 < 0x400) {
      local_c8.fds_bits[0xe] = 0;
      local_c8.fds_bits[0xf] = 0;
      local_c8.fds_bits[0xc] = 0;
      local_c8.fds_bits[0xd] = 0;
      local_c8.fds_bits[10] = 0;
      local_c8.fds_bits[0xb] = 0;
      local_c8.fds_bits[8] = 0;
      local_c8.fds_bits[9] = 0;
      local_c8.fds_bits[6] = 0;
      local_c8.fds_bits[7] = 0;
      local_c8.fds_bits[4] = 0;
      local_c8.fds_bits[5] = 0;
      local_c8.fds_bits[2] = 0;
      local_c8.fds_bits[3] = 0;
      local_c8.fds_bits[0] = 0;
      local_c8.fds_bits[1] = 0;
      iVar5 = iVar4 + 0x3f;
      if (-1 < iVar4) {
        iVar5 = iVar4;
      }
      local_c8.fds_bits[iVar5 >> 6] =
           local_c8.fds_bits[iVar5 >> 6] | 1L << ((byte)(iVar4 % 0x40) & 0x3f);
      local_48.tv_sec = 0;
      local_48.tv_usec = 0;
      do {
        iVar5 = select(iVar4 + 1,&local_c8,(fd_set *)0x0,(fd_set *)0x0,&local_48);
        if (-1 < iVar5) {
          if (iVar5 == 0) goto LAB_00118ea6;
          goto LAB_00118d8a;
        }
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
      if (*piVar7 != 9) goto LAB_00118d8a;
    }
    else {
LAB_00118d8a:
      do {
        sVar8 = recv(iVar4,&local_c8,1,2);
        if (-1 < sVar8) {
          if (sVar8 != 0) goto LAB_00118ea6;
          break;
        }
        piVar7 = __errno_location();
      } while (*piVar7 == 4);
    }
    (*this->_vptr_ClientImpl[4])(this,socket,0);
    if (socket->sock != -1) {
      shutdown(socket->sock,2);
      if (socket->sock != -1) {
        close(socket->sock);
        socket->sock = -1;
      }
    }
  }
  iVar4 = (*this->_vptr_ClientImpl[3])(this,socket,__n);
  if ((char)iVar4 == '\0') {
LAB_00119096:
    uVar13 = 0;
LAB_00119098:
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
  }
  else {
    iVar4 = (*this->_vptr_ClientImpl[6])(this);
    if ((char)iVar4 != '\0') {
      if (((this->proxy_host_)._M_string_length != 0) && (this->proxy_port_ != -1)) {
        local_c8.fds_bits[0] = local_c8.fds_bits[0] & 0xffffffffffffff00;
        bVar3 = SSLClient::connect_with_proxy
                          ((SSLClient *)this,socket,(Response *)__buf,(bool *)&local_c8,(Error *)__n
                          );
        if (bVar3) goto LAB_00118e57;
        uVar13 = CONCAT71((int7)((ulong)socket >> 8),(char)local_c8.fds_bits[0]);
        goto LAB_00119098;
      }
LAB_00118e57:
      SSL_connect_or_accept.error = (Error *)__n;
      SSL_connect_or_accept.this = (SSLClient *)this;
      SSL_connect_or_accept.socket = socket;
      local_c8.fds_bits[0] = (__fd_mask)this;
      local_c8.fds_bits[1] = __n;
      local_c8.fds_bits[2] = (__fd_mask)socket;
      pSVar9 = detail::
               ssl_new<httplib::SSLClient::initialize_ssl(httplib::ClientImpl::Socket&,httplib::Error&)::_lambda(ssl_st*)_1_,httplib::SSLClient::initialize_ssl(httplib::ClientImpl::Socket&,httplib::Error&)::_lambda(ssl_st*)_2_>
                         ((this->socket_).sock,(SSL_CTX *)this[1]._vptr_ClientImpl,
                          (mutex *)&this[1].host_,SSL_connect_or_accept,
                          (anon_class_8_1_8991fb9c)this);
      if (pSVar9 == (SSL *)0x0) {
        if (socket->sock != -1) {
          shutdown(socket->sock,2);
          if (socket->sock != -1) {
            close(socket->sock);
            socket->sock = -1;
          }
        }
        goto LAB_00119096;
      }
      (this->socket_).ssl = pSVar9;
    }
LAB_00118ea6:
    this->socket_requests_in_flight_ = this->socket_requests_in_flight_ + 1;
    pVar10 = pthread_self();
    (this->socket_requests_are_from_thread_)._M_thread = pVar10;
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    p_Var12 = (this->default_headers_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
    p_Var1 = &(this->default_headers_)._M_t._M_impl.super__Rb_tree_header;
    if ((_Rb_tree_header *)p_Var12 != p_Var1) {
      this_00 = (ClientImpl *)(lVar14 + 0x40);
      do {
        __v = (pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
               *)(p_Var12 + 1);
        iVar11 = std::
                 _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                 ::find((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                         *)this_00,(key_type *)__v);
        if (iVar11._M_node == (_Base_ptr)(lVar14 + 0x48)) {
          pVar15 = std::
                   _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                   ::_M_get_insert_equal_pos
                             ((_Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_httplib::detail::ci,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
                               *)this_00,(key_type *)__v);
          local_c8.fds_bits[0] = (__fd_mask)this_00;
          std::
          _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
          ::
          _M_insert_<std::pair<std::__cxx11::string_const,std::__cxx11::string>const&,std::_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>::_Alloc_node>
                    ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,std::__cxx11::string>,std::_Select1st<std::pair<std::__cxx11::string_const,std::__cxx11::string>>,httplib::detail::ci,std::allocator<std::pair<std::__cxx11::string_const,std::__cxx11::string>>>
                      *)this_00,pVar15.first,pVar15.second,__v,(_Alloc_node *)&local_c8);
        }
        p_Var12 = (_Rb_tree_node_base *)std::_Rb_tree_increment(p_Var12);
      } while ((_Rb_tree_header *)p_Var12 != p_Var1);
    }
    local_c8.fds_bits[0] = CONCAT71(local_c8.fds_bits[0]._1_7_,this->keep_alive_) ^ 1;
    local_e8 = (undefined8 *)0x0;
    uStack_e0 = 0;
    local_d8 = (code *)0x0;
    pcStack_d0 = (code *)0x0;
    local_e8 = (undefined8 *)operator_new(0x28);
    *local_e8 = this;
    local_e8[1] = lVar14;
    local_e8[2] = __buf;
    local_e8[3] = &local_c8;
    local_e8[4] = __n;
    pcStack_d0 = std::
                 _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:6057:44)>
                 ::_M_invoke;
    local_d8 = std::
               _Function_handler<bool_(httplib::Stream_&),_(lambda_at_/workspace/llm4binary/github/license_c_cmakelists/Narase33[P]std_bot_cpp/libs/httplib/httplib.h:6057:44)>
               ::_M_manager;
    uVar6 = (*this->_vptr_ClientImpl[5])(this,socket);
    uVar13 = (ulong)uVar6;
    if (local_d8 != (code *)0x0) {
      (*local_d8)(&local_e8,&local_e8,3);
    }
    iVar4 = pthread_mutex_lock((pthread_mutex_t *)__mutex);
    if (iVar4 != 0) {
      std::__throw_system_error(iVar4);
    }
    psVar2 = &this->socket_requests_in_flight_;
    *psVar2 = *psVar2 - 1;
    if (*psVar2 == 0) {
      (this->socket_requests_are_from_thread_)._M_thread = 0;
    }
    if (((this->socket_should_be_closed_when_request_is_done_ != false) || ((char)uVar6 == '\0')) ||
       ((char)local_c8.fds_bits[0] != '\0')) {
      (*this->_vptr_ClientImpl[4])(this,socket,1);
      if (socket->sock != -1) {
        shutdown(socket->sock,2);
        if (socket->sock != -1) {
          close(socket->sock);
          socket->sock = -1;
        }
      }
    }
    pthread_mutex_unlock((pthread_mutex_t *)__mutex);
    if (*(int *)__n == 0 && (char)uVar6 == '\0') {
      *(undefined4 *)__n = 1;
    }
  }
  pthread_mutex_unlock((pthread_mutex_t *)&this->request_mutex_);
  return uVar13 & 0xffffff01;
}

Assistant:

inline bool ClientImpl::send(Request& req, Response& res, Error& error) {
        std::lock_guard<std::recursive_mutex> request_mutex_guard(request_mutex_);

        {
            std::lock_guard<std::mutex> guard(socket_mutex_);

            // Set this to false immediately - if it ever gets set to true by the end of
            // the request, we know another thread instructed us to close the socket.
            socket_should_be_closed_when_request_is_done_ = false;

            auto is_alive = false;
            if (socket_.is_open()) {
                is_alive = detail::is_socket_alive(socket_.sock);
                if (!is_alive) {
                    // Attempt to avoid sigpipe by shutting down nongracefully if it seems
                    // like the other side has already closed the connection Also, there
                    // cannot be any requests in flight from other threads since we locked
                    // request_mutex_, so safe to close everything immediately
                    const bool shutdown_gracefully = false;
                    shutdown_ssl(socket_, shutdown_gracefully);
                    shutdown_socket(socket_);
                    close_socket(socket_);
                }
            }

            if (!is_alive) {
                if (!create_and_connect_socket(socket_, error)) { return false; }

            #ifdef CPPHTTPLIB_OPENSSL_SUPPORT
                // TODO: refactoring
                if (is_ssl()) {
                    auto& scli = static_cast<SSLClient&>(*this);
                    if (!proxy_host_.empty() && proxy_port_ != -1) {
                        bool success = false;
                        if (!scli.connect_with_proxy(socket_, res, success, error)) {
                            return success;
                        }
                    }

                    if (!scli.initialize_ssl(socket_, error)) { return false; }
                }
            #endif
            }

            // Mark the current socket as being in use so that it cannot be closed by
            // anyone else while this request is ongoing, even though we will be
            // releasing the mutex.
            if (socket_requests_in_flight_ > 1) {
                assert(socket_requests_are_from_thread_ == std::this_thread::get_id());
            }
            socket_requests_in_flight_ += 1;
            socket_requests_are_from_thread_ = std::this_thread::get_id();
        }

        for (const auto& header : default_headers_) {
            if (req.headers.find(header.first) == req.headers.end()) {
                req.headers.insert(header);
            }
        }

        auto close_connection = !keep_alive_;
        auto ret = process_socket(socket_, [&](Stream& strm) {
            return handle_request(strm, req, res, close_connection, error);
        });

        // Briefly lock mutex in order to mark that a request is no longer ongoing
        {
            std::lock_guard<std::mutex> guard(socket_mutex_);
            socket_requests_in_flight_ -= 1;
            if (socket_requests_in_flight_ <= 0) {
                assert(socket_requests_in_flight_ == 0);
                socket_requests_are_from_thread_ = std::thread::id();
            }

            if (socket_should_be_closed_when_request_is_done_ || close_connection ||
                !ret) {
                shutdown_ssl(socket_, true);
                shutdown_socket(socket_);
                close_socket(socket_);
            }
        }

        if (!ret) {
            if (error == Error::Success) { error = Error::Unknown; }
        }

        return ret;
    }